

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-test.c++
# Opt level: O1

Own<kj::File> kj::anon_unknown_0::newTempFile(void)

{
  Fault __name;
  int iVar1;
  File *extraout_RDX;
  File *extraout_RDX_00;
  File *pFVar2;
  kj *in_RDI;
  Own<kj::File> OVar3;
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_filesystem_disk_test_c__:213:3)>
  _kjDefer213;
  char filename [35];
  AutoCloseFd local_78;
  Fault local_70;
  undefined1 local_68;
  Fault local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  char local_48;
  char cStack_47;
  char cStack_46;
  char cStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  char cStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  char cStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  char cStack_39;
  char local_38;
  char cStack_37;
  char cStack_36;
  char cStack_35;
  char cStack_34;
  char cStack_33;
  char cStack_32;
  char cStack_31;
  undefined7 uStack_30;
  undefined4 uStack_29;
  
  local_38 = 's';
  cStack_37 = 'y';
  cStack_36 = 's';
  cStack_35 = 't';
  cStack_34 = 'e';
  cStack_33 = 'm';
  cStack_32 = '-';
  cStack_31 = 't';
  uStack_30 = 0x5858582e747365;
  local_48 = '/';
  cStack_47 = 'v';
  cStack_46 = 'a';
  cStack_45 = 'r';
  cStack_44 = '/';
  cStack_43 = 't';
  cStack_42 = 'm';
  cStack_41 = 'p';
  cStack_40 = '/';
  cStack_3f = 'k';
  cStack_3e = 'j';
  cStack_3d = '-';
  cStack_3c = 'f';
  cStack_3b = 'i';
  cStack_3a = 'l';
  cStack_39 = 'e';
  uStack_29 = 0x585858;
  do {
    local_78.fd = mkstemp(&stack0xffffffffffffffb8);
    if (-1 < local_78.fd) {
      iVar1 = 0;
      break;
    }
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_70.exception = (Exception *)0x0;
    local_58 = 0;
    uStack_50 = 0;
    _::Debug::Fault::init
              (&local_70,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
              );
    _::Debug::Fault::fatal(&local_70);
  }
  local_68 = 0;
  local_70.exception = (Exception *)&stack0xffffffffffffffb8;
  UnwindDetector::UnwindDetector(&local_78.unwindDetector);
  newDiskFile(in_RDI,&local_78);
  AutoCloseFd::~AutoCloseFd(&local_78);
  __name.exception = local_70.exception;
  do {
    iVar1 = unlink((char *)__name.exception);
    if (-1 < iVar1) {
      iVar1 = 0;
      pFVar2 = extraout_RDX;
      break;
    }
    iVar1 = _::Debug::getOsErrorNumber(false);
    pFVar2 = extraout_RDX_00;
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_60.exception = (Exception *)0x0;
    local_58 = 0;
    uStack_50 = 0;
    _::Debug::Fault::init
              (&local_60,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
              );
    _::Debug::Fault::fatal(&local_60);
  }
  OVar3.ptr = pFVar2;
  OVar3.disposer = (Disposer *)in_RDI;
  return OVar3;
}

Assistant:

static Own<File> newTempFile() {
  char filename[] = VAR_TMP "/kj-filesystem-test.XXXXXX";
  int fd;
  KJ_SYSCALL(fd = mkstemp(filename));
  KJ_DEFER(KJ_SYSCALL(unlink(filename)));
  return newDiskFile(AutoCloseFd(fd));
}